

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_4faa5c::Db::parseClassEnumType(Db *this)

{
  bool bVar1;
  Node *pNVar2;
  Node *pNVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  StringView S;
  StringView S_00;
  StringView S_01;
  
  S.Last = "";
  S.First = "Ts";
  bVar1 = consumeIf(this,S);
  if (bVar1) {
    pp_Var4 = (_func_int **)0x1bb1a0;
    pp_Var5 = (_func_int **)0x1bb19a;
  }
  else {
    S_00.Last = "";
    S_00.First = "Tu";
    bVar1 = consumeIf(this,S_00);
    if (bVar1) {
      pp_Var4 = (_func_int **)0x1de0a0;
      pp_Var5 = (_func_int **)"union";
    }
    else {
      S_01.Last = "";
      S_01.First = "Te";
      bVar1 = consumeIf(this,S_01);
      pp_Var4 = (_func_int **)0x1c0dad;
      if (!bVar1) {
        pp_Var4 = (_func_int **)0x0;
      }
      pp_Var5 = (_func_int **)0x1c0da9;
      if (!bVar1) {
        pp_Var5 = (_func_int **)0x0;
      }
    }
  }
  pNVar2 = parseName(this,(NameState *)0x0);
  pNVar3 = (Node *)0x0;
  if ((pNVar2 != (Node *)0x0) && (pNVar3 = pNVar2, pp_Var5 != pp_Var4)) {
    pNVar3 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
    pNVar3->K = KElaboratedTypeSpefType;
    pNVar3->RHSComponentCache = No;
    pNVar3->ArrayCache = No;
    pNVar3->FunctionCache = No;
    pNVar3->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0022fb78;
    pNVar3[1]._vptr_Node = pp_Var5;
    *(_func_int ***)&pNVar3[1].K = pp_Var4;
    pNVar3[2]._vptr_Node = (_func_int **)pNVar2;
  }
  return pNVar3;
}

Assistant:

Node *Db::parseClassEnumType() {
  StringView ElabSpef;
  if (consumeIf("Ts"))
    ElabSpef = "struct";
  else if (consumeIf("Tu"))
    ElabSpef = "union";
  else if (consumeIf("Te"))
    ElabSpef = "enum";

  Node *Name = parseName();
  if (Name == nullptr)
    return nullptr;

  if (!ElabSpef.empty())
    return make<ElaboratedTypeSpefType>(ElabSpef, Name);

  return Name;
}